

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void ReadableSizeString(size_t SizeInBytes,char *Output,size_t size)

{
  ulong uVar1;
  uint uVar2;
  size_t LastSizeInBytes;
  undefined8 *puVar3;
  
  uVar2 = 0;
  if (0x400 < SizeInBytes) {
    uVar2 = 0;
    puVar3 = &DAT_00877e40;
    do {
      uVar1 = SizeInBytes;
      SizeInBytes = uVar1 >> 10;
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + 1;
    } while (0x1003ff < uVar1);
    if (uVar1 < 0x19000) {
      snprintf(Output,0x100,"%.1f %s",(double)(long)uVar1 * 0.0009765625,*puVar3);
      return;
    }
  }
  snprintf(Output,0x100,"%zd %s",SizeInBytes,(&DAT_00877e40)[uVar2]);
  return;
}

Assistant:

static void ReadableSizeString(size_t SizeInBytes, char *Output, size_t size)
{
    int i = 0;
    size_t LastSizeInBytes = SizeInBytes;
    char *byteUnits[] = {"bytes", "kB", "MB", "GB", "TB", "PB", "EB", "ZB", "YB"};

    while (SizeInBytes > 1024)
    {
        LastSizeInBytes = SizeInBytes;
        SizeInBytes = SizeInBytes / 1024;
        i++;
    }

    if ((SizeInBytes < 100) && (i != 0))
    {
        snprintf(Output, size, "%.1f %s", ((double)LastSizeInBytes) / 1024, byteUnits[i]);
    }
    else
    {
        snprintf(Output, size, "%zd %s", SizeInBytes, byteUnits[i]);
    }
}